

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpFixedLengthEntityReader::tryRead
          (HttpFixedLengthEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  HttpInputStreamImpl *pHVar1;
  HttpInputStreamImpl *this_00;
  ulong maxBytes_00;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_00;
  ImmediatePromiseNode<unsigned_long> *pIVar2;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar3;
  Promise<unsigned_long> PVar4;
  HttpInputStream local_38;
  HttpInputStreamImpl *pHStack_30;
  char *local_28;
  
  maxBytes_00 = *(ulong *)((long)buffer + 0x18);
  if (maxBytes_00 == 0) {
    local_28 = (char *)0x0;
    OVar3 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                      ((kj *)&stack0xffffffffffffffc8,(unsigned_long *)&stack0xffffffffffffffd8);
    pIVar2 = OVar3.ptr;
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         local_38._vptr_HttpInputStream;
    (this->super_HttpEntityBodyReader).inner = pHStack_30;
  }
  else {
    if (maxBytes < maxBytes_00) {
      maxBytes_00 = maxBytes;
    }
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)&stack0xffffffffffffffc8,*(void **)((long)buffer + 8),minBytes
               ,maxBytes_00);
    this_00 = (HttpInputStreamImpl *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,
               (Own<kj::_::PromiseNode> *)&stack0xffffffffffffffc8,
               _::
               TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1497:15),_kj::_::PropagateException>
               ::anon_class_16_2_dfc37374_for_func::operator());
    pHVar1 = pHStack_30;
    (this_00->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_00442208;
    (this_00->headerBuffer).disposer = (ArrayDisposer *)buffer;
    this_00->messageHeaderEnd = maxBytes;
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpFixedLengthEntityReader::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    (this->super_HttpEntityBodyReader).inner = this_00;
    pIVar2 = extraout_RDX;
    if (pHStack_30 != (HttpInputStreamImpl *)0x0) {
      pHStack_30 = (HttpInputStreamImpl *)0x0;
      (**(code **)*local_38._vptr_HttpInputStream)
                (local_38._vptr_HttpInputStream,
                 (pHVar1->super_HttpInputStream)._vptr_HttpInputStream[-2] +
                 (long)&(pHVar1->super_HttpInputStream)._vptr_HttpInputStream);
      pIVar2 = extraout_RDX_00;
    }
  }
  PVar4.super_PromiseBase.node.ptr = (PromiseNode *)pIVar2;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (length == 0) return size_t(0);

    return inner.tryRead(buffer, kj::min(minBytes, length), kj::min(maxBytes, length))
        .then([=](size_t amount) {
      length -= amount;
      if (length > 0 && amount < minBytes) {
        kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED,
            "premature EOF in HTTP entity body; did not reach Content-Length"));
      } else if (length == 0) {
        doneReading();
      }
      return amount;
    });
  }